

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O2

void iterator_set_del_docs_test(void)

{
  ulong uVar1;
  fdb_status fVar2;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  long lVar3;
  char *__format;
  ulong uVar4;
  uint uVar5;
  fdb_kvs_handle *kv1;
  ulong local_7c0;
  fdb_iterator *it;
  fdb_file_handle *dbfile;
  fdb_doc *vdoc;
  fdb_kvs_info info;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char keybuf [256];
  char metabuf [256];
  fdb_doc *apfStack_448 [100];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fconfig.wal_threshold = 0x400;
  fconfig.purging_interval = 1;
  fconfig.compaction_threshold = '\n';
  fconfig.flags = fconfig.purging_interval;
  fdb_open(&dbfile,"./iterator_test1",&fconfig);
  fdb_kvs_open(dbfile,&kv1,"kv1",&kvs_config);
  local_7c0 = 0;
  uVar5 = 0;
  do {
    if (uVar5 == 0x14) {
      fdb_kvs_close(kv1);
      fdb_close(dbfile);
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (iterator_set_del_docs_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"iterator set del docs");
      return;
    }
    lVar3 = 0;
    for (uVar4 = 0; uVar4 != 100; uVar4 = uVar4 + 1) {
      sprintf(keybuf,"key%02d%03d",(ulong)uVar5,uVar4 & 0xffffffff);
      sprintf(metabuf,"meta%02d%03d",(ulong)uVar5,uVar4 & 0xffffffff);
      sprintf(bodybuf,"body%02d%03d",(ulong)uVar5,uVar4 & 0xffffffff);
      keylen = strlen(keybuf);
      metalen = strlen(metabuf);
      bodylen = strlen(bodybuf);
      fdb_doc_create((fdb_doc **)((long)apfStack_448 + lVar3),keybuf,keylen,metabuf,metalen,bodybuf,
                     bodylen);
      fdb_set(kv1,apfStack_448[uVar4]);
      lVar3 = lVar3 + 8;
    }
    fdb_commit(dbfile,'\x01');
    for (lVar3 = 0; lVar3 != 0x19; lVar3 = lVar3 + 1) {
      fdb_del(kv1,apfStack_448[lVar3 + 0x19]);
    }
    uVar4 = local_7c0 + 0x4b;
    fdb_commit(dbfile,'\x01');
    fdb_get_kvs_info(kv1,&info);
    local_7c0 = uVar4;
    if (info.doc_count != uVar4) {
      uVar4 = 0;
      fdb_iterator_init(kv1,&it,(void *)0x0,0,(void *)0x0,0,0);
      do {
        fdb_iterator_get(it,&vdoc);
        uVar4 = (ulong)((int)uVar4 + (vdoc->deleted ^ 1));
        fdb_doc_free(vdoc);
        fVar2 = fdb_iterator_next(it);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      fdb_iterator_close(it);
      uVar1 = local_7c0;
      printf("dbdocs(%d) expected(%d)\n",uVar4,local_7c0 & 0xffffffff);
      if (info.doc_count != uVar1) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
               );
        iterator_set_del_docs_test()::__test_pass = '\x01';
        if (info.doc_count != local_7c0) {
          __assert_fail("info.doc_count == (size_t)expected_doc_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0x72b,"void iterator_set_del_docs_test()");
        }
      }
    }
    for (lVar3 = 0; lVar3 != 100; lVar3 = lVar3 + 1) {
      fdb_doc_free(apfStack_448[lVar3]);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void iterator_set_del_docs_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    int i, j, k, n=100;
    int expected_doc_count=0;
    char keybuf[256], metabuf[256], bodybuf[256];
    int val2;
    fdb_file_handle *dbfile;
    fdb_iterator *it;
    fdb_kvs_handle *kv1;
    fdb_kvs_info info;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *vdoc;
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 10;
    fconfig.purging_interval = 1; //retain deletes until compaction

    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);

    for(k=0;k<20;++k){
        // set n docs
        for(i=0;i<n;++i){
            sprintf(keybuf, "key%02d%03d", k, i);
            sprintf(metabuf, "meta%02d%03d", k, i);
            sprintf(bodybuf, "body%02d%03d", k, i);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
            fdb_set(kv1, doc[i]);
            expected_doc_count++;
        }

        // commit
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

        // delete subset of recently loaded docs
        for(j=n/4;j<n/2;j++){
            fdb_del(kv1, doc[j]);
            expected_doc_count--;
        }
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

        fdb_get_kvs_info(kv1, &info);
        if(info.doc_count != (size_t)expected_doc_count){
            // test already failed further debugging check info
            fdb_iterator_init(kv1, &it, NULL, 0,
                              NULL, 0, FDB_ITR_NONE);
            val2=0;
            do {
                fdb_iterator_get(it, &vdoc);
                if (!vdoc->deleted){
                    val2++;
                }
                fdb_doc_free(vdoc);
            } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
            fdb_iterator_close(it);
            printf("dbdocs(%d) expected(%d)\n", val2, expected_doc_count);
        }
        TEST_CHK(info.doc_count == (size_t)expected_doc_count);

        // preliminary cleanup
        for(i=0;i<n;++i){
            fdb_doc_free(doc[i]);
        }
    }

    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();

    TEST_RESULT("iterator set del docs");
}